

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O2

void non_temporal_encrypt_v256
               (st_ptls_aead_context_t *_ctx,void *_output,ptls_iovec_t *input,size_t incnt,
               uint64_t seq,void *_aad,size_t aadlen)

{
  st_ptls_aead_algorithm_t *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i X;
  __m256i X_00;
  __m256i X_01;
  __m256i X_02;
  __m256i X_03;
  __m256i X_04;
  size_t sVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  undefined8 *puVar7;
  ptls_fusion_aesgcm_ghash_precompute256 *precompute;
  longlong *__return_storage_ptr__;
  ulong uVar8;
  long lVar9;
  void *p;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ptls_fusion_gfmul_state256 gstate;
  uint8_t encbuf [288];
  undefined1 in_stack_fffffffffffffca8 [24];
  ptls_fusion_gfmul_state256 local_220;
  undefined1 local_1c0 [32];
  char *local_1a0;
  uint64_t uStack_198;
  uint64_t uStack_190;
  ptls_cipher_algorithm_t *ppStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  
  if (((ulong)_output & 0x3f) != 0) {
    puVar7 = (undefined8 *)((long)_output - ((ulong)_output & 0x3f));
    local_180 = *puVar7;
    uStack_178 = puVar7[1];
    uStack_170 = puVar7[2];
    uStack_168 = puVar7[3];
    local_160 = puVar7[4];
    uStack_158 = puVar7[5];
    uStack_150 = puVar7[6];
    uStack_148 = puVar7[7];
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = seq;
  auVar11 = vpslldq_avx(auVar11,4);
  auVar2._0_8_ = _ctx[1].do_get_iv;
  auVar2._8_8_ = _ctx[1].do_set_iv;
  auVar11 = auVar11 ^ auVar2;
  auVar12._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar11;
  auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  auVar13._8_4_ = 1;
  auVar13._0_8_ = 0x100000001;
  auVar13._12_4_ = 1;
  auVar13._16_4_ = 1;
  auVar13._20_4_ = 1;
  auVar13._24_4_ = 1;
  auVar13._28_4_ = 1;
  auVar13 = vpblendd_avx2(auVar12,auVar13,0x10);
  sVar6 = calc_total_length(input,incnt);
  auVar2 = vpunpcklqdq_avx(ZEXT416((uint)((int)sVar6 << 3)),ZEXT416((uint)((int)aadlen * 8)));
  auVar2 = vpshufb_avx(auVar2,_DAT_00129c70);
  auVar12 = vpshufb_avx2(auVar13,_DAT_00129da0);
  local_1c0 = vpblendd_avx2(auVar12,ZEXT1632(auVar2),0xf);
  psVar1 = _ctx[1].algo;
  local_220.mid[0] = 0;
  local_220.mid[1] = 0;
  local_220.mid[2] = 0;
  local_220.mid[3] = 0;
  local_220.lo[0] = 0;
  local_220.lo[1] = 0;
  local_220.lo[2] = 0;
  local_220.lo[3] = 0;
  local_220.hi[0] = 0;
  local_220.hi[1] = 0;
  local_220.hi[2] = 0;
  local_220.hi[3] = 0;
  sVar6 = 0;
  while( true ) {
    if ((sVar6 != 0) || (incnt == 0)) break;
    sVar6 = input->len;
    input = input + 1;
    incnt = incnt - 1;
  }
  auVar12 = vpaddq_avx2(auVar13,_DAT_00129e80);
  auVar14._16_16_ = _DAT_00129c80;
  auVar14._0_16_ = _DAT_00129c80;
  auVar12 = vpshufb_avx2(auVar12,auVar14);
  if ((sVar6 < 0xb1) && (incnt == 0)) {
    vpblendd_avx2(auVar12,local_1c0,0xf0);
  }
  local_1a0 = psVar1->name;
  uStack_198 = psVar1->confidentiality_limit;
  uStack_190 = psVar1->integrity_limit;
  ppStack_188 = psVar1->ctr_cipher;
  if (aadlen != 0) {
    sVar6 = extraout_RDX;
    for (; (void *)0xbf < aadlen; aadlen = aadlen + -0xc0) {
      X[1] = in_stack_fffffffffffffca8._0_8_;
      X[2] = in_stack_fffffffffffffca8._8_8_;
      X[3] = in_stack_fffffffffffffca8._16_8_;
      X[0] = (longlong)_aad;
      gfmul_firststep256(&local_220,X,0,
                         (ptls_fusion_aesgcm_ghash_precompute256 *)&psVar1[8].ecb_cipher);
      for (lVar9 = 800; _aad = (void *)((long)_aad + 0x20), (int)lVar9 != 0x1e0;
          lVar9 = lVar9 + -0x40) {
        X_00[1] = in_stack_fffffffffffffca8._0_8_;
        X_00[2] = in_stack_fffffffffffffca8._8_8_;
        X_00[3] = in_stack_fffffffffffffca8._16_8_;
        X_00[0] = (longlong)_aad;
        gfmul_nextstep256(&local_220,X_00,
                          (ptls_fusion_aesgcm_ghash_precompute256 *)((long)&psVar1->name + lVar9));
      }
      gfmul_reduce256(&local_220);
      auVar14._16_16_ = _DAT_00129c80;
      auVar14._0_16_ = _DAT_00129c80;
      sVar6 = extraout_RDX_00;
    }
    if ((void *)aadlen != (void *)0x0) {
      uVar8 = (ulong)((uint)aadlen * 2 + 0x3e & 0x3c0);
      if (aadlen < (void *)0x20) {
        loadn256((__m256i *)_aad,(void *)aadlen,sVar6);
        lVar9 = uVar8 + 0x1e0;
        X_01[1] = in_stack_fffffffffffffca8._0_8_;
        X_01[2] = in_stack_fffffffffffffca8._8_8_;
        X_01[3] = in_stack_fffffffffffffca8._16_8_;
        X_01[0] = (longlong)_aad;
        gfmul_firststep256(&local_220,X_01,(uint)(aadlen < (void *)0x11),
                           (ptls_fusion_aesgcm_ghash_precompute256 *)
                           ((long)&psVar1[4].tls12.fixed_iv_size + uVar8));
      }
      else {
        bVar10 = (ulong)((uint)aadlen & 0x1f) - 1 < 0x10;
        lVar9 = uVar8 + 0x1e0;
        X_02[1] = in_stack_fffffffffffffca8._0_8_;
        X_02[2] = in_stack_fffffffffffffca8._8_8_;
        X_02[3] = in_stack_fffffffffffffca8._16_8_;
        X_02[0] = (longlong)_aad;
        gfmul_firststep256(&local_220,X_02,(uint)bVar10,
                           (ptls_fusion_aesgcm_ghash_precompute256 *)
                           ((long)&psVar1[4].tls12.fixed_iv_size + uVar8));
        __return_storage_ptr__ = *(__m256i *)_aad + (ulong)!bVar10 * 2 + 2;
        sVar6 = extraout_RDX_01;
        for (p = (void *)(((ulong)bVar10 << 4 | 0xffffffffffffffe0) + aadlen);
            precompute = (ptls_fusion_aesgcm_ghash_precompute256 *)((long)psVar1 + lVar9 + -0x40),
            (void *)0x1f < p; p = (void *)((long)p + -0x20)) {
          lVar9 = lVar9 + -0x40;
          X_03[1] = in_stack_fffffffffffffca8._0_8_;
          X_03[2] = in_stack_fffffffffffffca8._8_8_;
          X_03[3] = in_stack_fffffffffffffca8._16_8_;
          X_03[0] = (longlong)p;
          gfmul_nextstep256(&local_220,X_03,precompute);
          __return_storage_ptr__ = __return_storage_ptr__ + 4;
          sVar6 = extraout_RDX_02;
        }
        if (p != (void *)0x0) {
          if (p < (void *)0x11) {
            __assert_fail("aadlen > 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/fusion.c"
                          ,0x78f,
                          "void non_temporal_encrypt_v256(struct st_ptls_aead_context_t *, void *, ptls_iovec_t *, size_t, uint64_t, const void *, size_t)"
                         );
          }
          loadn256((__m256i *)__return_storage_ptr__,p,sVar6);
          lVar9 = lVar9 + -0x40;
          X_04[1] = in_stack_fffffffffffffca8._0_8_;
          X_04[2] = in_stack_fffffffffffffca8._8_8_;
          X_04[3] = in_stack_fffffffffffffca8._16_8_;
          X_04[0] = (longlong)p;
          gfmul_nextstep256(&local_220,X_04,precompute);
        }
      }
      if (lVar9 != 0x220) {
        __assert_fail("ctx->ghash == ghash_precompute",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/fusion.c"
                      ,0x795,
                      "void non_temporal_encrypt_v256(struct st_ptls_aead_context_t *, void *, ptls_iovec_t *, size_t, uint64_t, const void *, size_t)"
                     );
      }
      gfmul_reduce256(&local_220);
      auVar14._16_16_ = _DAT_00129c80;
      auVar14._0_16_ = _DAT_00129c80;
    }
  }
  auVar12 = vpaddq_avx2(auVar13,_DAT_00129dc0);
  auVar3 = vpaddq_avx2(auVar13,_DAT_00129e00);
  auVar4 = vpaddq_avx2(auVar13,_DAT_00129e20);
  auVar5 = vpaddq_avx2(auVar13,_DAT_00129e40);
  auVar13 = vpaddq_avx2(auVar13,_DAT_00129e60);
  vpshufb_avx2(auVar12,auVar14);
  vpshufb_avx2(auVar3,auVar14);
  vpshufb_avx2(auVar4,auVar14);
  vpshufb_avx2(auVar5,auVar14);
  vpshufb_avx2(auVar13,auVar14);
  halt_baddata();
}

Assistant:

NO_SANITIZE_ADDRESS
static void non_temporal_encrypt_v256(struct st_ptls_aead_context_t *_ctx, void *_output, ptls_iovec_t *input, size_t incnt,
                                      uint64_t seq, const void *_aad, size_t aadlen)
{
/* init the bits (we can always run in full), but use the last slot for calculating ek0, if possible */
#define AESECB6_INIT()                                                                                                             \
    do {                                                                                                                           \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits0 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits1 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits2 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits3 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits4 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits5 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        if (PTLS_UNLIKELY(srclen <= 32 * 6 - 16) && src_vecleft == 0) {                                                            \
            bits5 = _mm256_permute2f128_si256(bits5, ac_ek0, 0x30);                                                                \
            state |= STATE_EK0_READY;                                                                                              \
        }                                                                                                                          \
        __m256i k = ctx->super.ecb.keys.m256[0];                                                                                   \
        bits0 = _mm256_xor_si256(bits0, k);                                                                                        \
        bits1 = _mm256_xor_si256(bits1, k);                                                                                        \
        bits2 = _mm256_xor_si256(bits2, k);                                                                                        \
        bits3 = _mm256_xor_si256(bits3, k);                                                                                        \
        bits4 = _mm256_xor_si256(bits4, k);                                                                                        \
        bits5 = _mm256_xor_si256(bits5, k);                                                                                        \
    } while (0)

/* aes block update */
#define AESECB6_UPDATE(i)                                                                                                          \
    do {                                                                                                                           \
        __m256i k = ctx->super.ecb.keys.m256[i];                                                                                   \
        bits0 = _mm256_aesenc_epi128(bits0, k);                                                                                    \
        bits1 = _mm256_aesenc_epi128(bits1, k);                                                                                    \
        bits2 = _mm256_aesenc_epi128(bits2, k);                                                                                    \
        bits3 = _mm256_aesenc_epi128(bits3, k);                                                                                    \
        bits4 = _mm256_aesenc_epi128(bits4, k);                                                                                    \
        bits5 = _mm256_aesenc_epi128(bits5, k);                                                                                    \
    } while (0)

/* aesenclast */
#define AESECB6_FINAL(i)                                                                                                           \
    do {                                                                                                                           \
        __m256i k = ctx->super.ecb.keys.m256[i];                                                                                   \
        bits0 = _mm256_aesenclast_epi128(bits0, k);                                                                                \
        bits1 = _mm256_aesenclast_epi128(bits1, k);                                                                                \
        bits2 = _mm256_aesenclast_epi128(bits2, k);                                                                                \
        bits3 = _mm256_aesenclast_epi128(bits3, k);                                                                                \
        bits4 = _mm256_aesenclast_epi128(bits4, k);                                                                                \
        bits5 = _mm256_aesenclast_epi128(bits5, k);                                                                                \
    } while (0)

    struct aesgcm_context *agctx = (void *)_ctx;
    uint8_t *output = _output;
    const uint8_t *aad = _aad;

#define STATE_EK0_READY 0x1
    int32_t state = 0;

    /* Bytes are written here first then written using NT store instructions, 64 bytes at a time. */
    uint8_t encbuf[32 * 9] __attribute__((aligned(32))), *encp;

    /* `encbuf` should be large enough to store up to 63-bytes of unaligned bytes, 6 16-byte AES blocks, plus AEAD tag that is
     * append to the ciphertext before writing the bytes to main memory using NT store instructions. */
    PTLS_BUILD_ASSERT(sizeof(encbuf) >= 64 + 6 * 32 + 16);

    /* load unaligned data within same cache line preceding `output`, adjusting pointers accordingly */
    encp = load_preceding_unaligned(encbuf, &output);

    /* setup ctr, retaining Ek(0), len(A) | len(C) to be fed into GCM */
    __m256i ctr = _mm256_broadcastsi128_si256(calc_counter(agctx, seq));
    ctr = _mm256_insert_epi32(ctr, 1, 4);
    __m256i ac_ek0 = _mm256_permute2f128_si256(
        /* first half: ac */
        _mm256_castsi128_si256(
            _mm_shuffle_epi8(_mm_set_epi32(0, (int)aadlen * 8, 0, (int)calc_total_length(input, incnt) * 8), byteswap128)),
        /* second half: ek0 */
        _mm256_shuffle_epi8(ctr, byteswap256), 0x30);

    struct ptls_fusion_aesgcm_context256 *ctx = (void *)agctx->aesgcm;
    __m256i bits0, bits1, bits2, bits3, bits4, bits5 = _mm256_setzero_si256();
    struct ptls_fusion_gfmul_state256 gstate = {0};

    /* find the first non-empty vec */
    const uint8_t *src = NULL;
    size_t srclen = 0, src_vecleft = incnt;
    while (srclen == 0 && src_vecleft != 0) {
        src = (void *)input[0].base;
        srclen = input[0].len;
        ++input;
        --src_vecleft;
    }

    /* Prepare first 6 blocks of bit stream, at the same time calculating ghash of AAD. */
    AESECB6_INIT();
    AESECB6_UPDATE(1);
    AESECB6_UPDATE(2);
    if (PTLS_LIKELY(aadlen != 0)) {
        union ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute;
        while (PTLS_UNLIKELY(aadlen >= 6 * 32)) {
            ghash_precompute = ctx->ghash + 6;
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)aad), 0, --ghash_precompute);
            aad += 32;
            aadlen -= 32;
            for (int i = 1; i < 6; ++i) {
                gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)aad), --ghash_precompute);
                aad += 32;
                aadlen -= 32;
            }
            gfmul_reduce256(&gstate);
        }
        if (PTLS_LIKELY(aadlen != 0)) {
            ghash_precompute = ctx->ghash + (aadlen + 31) / 32;
            if (PTLS_UNLIKELY(aadlen >= 32)) {
                if (aadlen % 32 == 0 || aadlen % 32 > 16) {
                    gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)aad), 0, --ghash_precompute);
                    aad += 32;
                    aadlen -= 32;
                } else {
                    gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)aad), 1, --ghash_precompute);
                    aad += 16;
                    aadlen -= 16;
                }
                while (aadlen >= 32) {
                    gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)aad), --ghash_precompute);
                    aad += 32;
                    aadlen -= 32;
                }
                if (PTLS_LIKELY(aadlen != 0)) {
                    assert(aadlen > 16);
                    gfmul_nextstep256(&gstate, loadn256(aad, aadlen), --ghash_precompute);
                }
            } else {
                gfmul_firststep256(&gstate, loadn256(aad, aadlen), aadlen <= 16, --ghash_precompute);
            }
            assert(ctx->ghash == ghash_precompute);
            gfmul_reduce256(&gstate);
        }
    }
    for (size_t i = 3; i < ctx->super.ecb.rounds; ++i)
        AESECB6_UPDATE(i);
    AESECB6_FINAL(ctx->super.ecb.rounds);

    /* Main loop. This loop:
     *  1. using current keystream (bits0..bits5), xors a up to 6 * 16 bytes and writes to encbuf,
     *  2. then if there is no more data to be encrypted, exit the loop, otherwise,
     *  3. calculate ghash of the blocks being written to encbuf,
     *  4. calculate next 6 * 16 bytes of keystream,
     *  5. writes encbuf in 64-byte blocks
     * When exitting the loop, `remaining_ghash_from` represents the offset within `encbuf` from where ghash remains to be
     * calculated. */
    size_t remaining_ghash_from = encp - encbuf;
    if (srclen != 0) {
        while (1) {
            /* apply the bit stream to input, writing to encbuf */
            if (PTLS_LIKELY(srclen >= 6 * 32)) {
#define APPLY(i) _mm256_storeu_si256((void *)(encp + i * 32), _mm256_xor_si256(_mm256_loadu_si256((void *)(src + i * 32)), bits##i))
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
                encp += 6 * 32;
                src += 6 * 32;
                srclen -= 6 * 32;
                if (PTLS_UNLIKELY(srclen == 0)) {
                    if (src_vecleft == 0) {
                        remaining_ghash_from = (encp - encbuf) - 6 * 32;
                        break;
                    }
                    src = (void *)input[0].base;
                    srclen = input[0].len;
                    ++input;
                    --src_vecleft;
                }
            } else {
                /* slow path, load at most 6 * 32 bytes to encbuf then encrypt in-place */
                size_t bytes_copied = 0;
                do {
                    if (srclen >= 32 && bytes_copied < 5 * 32) {
                        _mm256_storeu_si256((void *)(encp + bytes_copied), _mm256_loadu_si256((void *)src));
                        bytes_copied += 32;
                        src += 32;
                        srclen -= 32;
                    } else {
                        encp[bytes_copied++] = *src++;
                        --srclen;
                    }
                    if (PTLS_UNLIKELY(srclen == 0)) {
                        do {
                            if (src_vecleft == 0)
                                break;
                            src = (void *)input[0].base;
                            srclen = input[0].len;
                            ++input;
                            --src_vecleft;
                        } while (srclen == 0);
                        if (srclen == 0)
                            break;
                    }
                } while (bytes_copied < 6 * 32);
#define APPLY(i)                                                                                                                   \
    _mm256_storeu_si256((void *)(encp + i * 32), _mm256_xor_si256(_mm256_loadu_si256((void *)(encp + i * 32)), bits##i))
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
                encp += bytes_copied;
                if (PTLS_UNLIKELY(srclen == 0)) {
                    /* Calculate amonut of data left to be ghashed, as well as zero-clearing the remainedr of partial block, as it
                     * will be fed into ghash. */
                    remaining_ghash_from = (encp - encbuf) - bytes_copied;
                    if ((bytes_copied & 15) != 0)
                        _mm_storeu_si128((void *)encp, _mm_setzero_si128());
                    break;
                }
            }

            /* Next 96-byte block starts here. Run AES and ghash in parallel while writing output using non-temporal store
             * instructions. */
            AESECB6_INIT();
            union ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute = ctx->ghash + 6;
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)(encp - 6 * 32)), 0, --ghash_precompute);
            AESECB6_UPDATE(1);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 5 * 32)), --ghash_precompute);
            AESECB6_UPDATE(2);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 4 * 32)), --ghash_precompute);
            AESECB6_UPDATE(3);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 3 * 32)), --ghash_precompute);
            AESECB6_UPDATE(4);
            _mm256_stream_si256((void *)output, _mm256_load_si256((void *)encbuf));
            _mm256_stream_si256((void *)(output + 32), _mm256_load_si256((void *)(encbuf + 32)));
            _mm256_stream_si256((void *)(output + 64), _mm256_load_si256((void *)(encbuf + 64)));
            _mm256_stream_si256((void *)(output + 96), _mm256_load_si256((void *)(encbuf + 96)));
            _mm256_stream_si256((void *)(output + 128), _mm256_load_si256((void *)(encbuf + 128)));
            _mm256_stream_si256((void *)(output + 160), _mm256_load_si256((void *)(encbuf + 160)));
            AESECB6_UPDATE(5);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 2 * 32)), --ghash_precompute);
            AESECB6_UPDATE(6);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 1 * 32)), --ghash_precompute);
            output += 192;
            encp -= 192;
            AESECB6_UPDATE(7);
            _mm256_store_si256((void *)encbuf, _mm256_load_si256((void *)(encbuf + 192)));
            AESECB6_UPDATE(8);
            _mm256_store_si256((void *)(encbuf + 32), _mm256_load_si256((void *)(encbuf + 224)));
            AESECB6_UPDATE(9);
            if (PTLS_UNLIKELY(ctx->super.ecb.rounds != 10)) {
                for (size_t i = 10; PTLS_LIKELY(i < ctx->super.ecb.rounds); ++i)
                    AESECB6_UPDATE(i);
            }
            assert(ctx->ghash == ghash_precompute);
            gfmul_reduce256(&gstate);
            AESECB6_FINAL(ctx->super.ecb.rounds);
        }
    }

    /* Now, All the encrypted bits are built in encbuf. Calculate AEAD tag and append to encbuf. */

    { /* Run ghash against the remaining bytes, after appending `ac` (i.e., len(A) | len(C)). At this point, we might be ghashing 7
       * blocks at once. */
        size_t ac_off = remaining_ghash_from + ((encp - encbuf) - remaining_ghash_from + 15) / 16 * 16;
        _mm_storeu_si128((void *)(encbuf + ac_off), _mm256_castsi256_si128(ac_ek0));
        size_t blocks = ((encp - encbuf) - remaining_ghash_from + 15) / 16 + 1; /* round up, +1 for AC */
        assert(blocks <= 13);
        union ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute = ctx->ghash + blocks / 2;
        if (blocks % 2 != 0) {
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)(encbuf + remaining_ghash_from)), 1, ghash_precompute);
            remaining_ghash_from += 16;
        } else {
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)(encbuf + remaining_ghash_from)), 0, --ghash_precompute);
            remaining_ghash_from += 32;
        }
        while (ghash_precompute != ctx->ghash) {
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encbuf + remaining_ghash_from)), --ghash_precompute);
            remaining_ghash_from += 32;
        }
        gfmul_reduce256(&gstate);
    }

    /* Calculate EK0, if in the unlikely case on not been done yet. When encoding in full size (16K), EK0 will be ready. */
    if (PTLS_UNLIKELY((state & STATE_EK0_READY) == 0)) {
        bits5 = ac_ek0;
        bits5 = _mm256_xor_si256(bits5, ctx->super.ecb.keys.m256[0]);
        for (size_t i = 1; i < ctx->super.ecb.rounds; ++i)
            bits5 = _mm256_aesenc_epi128(bits5, ctx->super.ecb.keys.m256[i]);
        bits5 = _mm256_aesenclast_epi128(bits5, ctx->super.ecb.keys.m256[ctx->super.ecb.rounds]);
    }

    /* append tag to encbuf */
    _mm_storeu_si128((void *)encp,
                     gfmul_get_tag256(&gstate, _mm256_castsi256_si128(_mm256_permute2f128_si256(bits5, bits5, 0x11))));
    encp += 16;

    /* write remaining bytes */
    write_remaining_bytes(output, encbuf, encp);
}